

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
          (KeyMapBase<unsigned_int> *this,ViewType k,TreeIterator *it)

{
  map_index_t b_00;
  bool bVar1;
  NodeAndBucket NVar2;
  RealKeyToVariantKey<unsigned_int> local_59;
  VariantKey local_58;
  uint local_44;
  KeyMapBase<unsigned_int> *local_40;
  NodeBase *node;
  TreeIterator *pTStack_30;
  map_index_t b;
  TreeIterator *it_local;
  KeyMapBase<unsigned_int> *pKStack_20;
  ViewType k_local;
  KeyMapBase<unsigned_int> *this_local;
  map_index_t local_10;
  
  pTStack_30 = it;
  it_local._4_4_ = k;
  pKStack_20 = this;
  node._4_4_ = BucketNumber(this,k);
  bVar1 = UntypedMapBase::TableEntryIsNonEmptyList(&this->super_UntypedMapBase,node._4_4_);
  if (bVar1) {
    local_40 = (KeyMapBase<unsigned_int> *)
               TableEntryToNode((this->super_UntypedMapBase).table_[node._4_4_]);
    do {
      local_44 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)local_40);
      bVar1 = TransparentSupport<unsigned_int>::Equals(&local_44,(uint *)((long)&it_local + 4));
      if (bVar1) {
        this_local = local_40;
        local_10 = node._4_4_;
        goto LAB_0044f952;
      }
      local_40 = *(KeyMapBase<unsigned_int> **)&local_40->super_UntypedMapBase;
    } while (local_40 != (KeyMapBase<unsigned_int> *)0x0);
  }
  else {
    bVar1 = UntypedMapBase::TableEntryIsTree(&this->super_UntypedMapBase,node._4_4_);
    b_00 = node._4_4_;
    if (bVar1) {
      local_58 = RealKeyToVariantKey<unsigned_int>::operator()(&local_59,it_local._4_4_);
      NVar2 = UntypedMapBase::FindFromTree(&this->super_UntypedMapBase,b_00,local_58,pTStack_30);
      this_local = (KeyMapBase<unsigned_int> *)NVar2.node;
      local_10 = NVar2.bucket;
      goto LAB_0044f952;
    }
  }
  this_local = (KeyMapBase<unsigned_int> *)0x0;
  local_10 = node._4_4_;
LAB_0044f952:
  NVar2.bucket = local_10;
  NVar2.node = (NodeBase *)this_local;
  NVar2._12_4_ = 0;
  return NVar2;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }